

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

void Abc_NtkAppendToCone(Abc_Ntk_t *pNtkNew,Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots)

{
  Nm_Man_t *p;
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Obj_t **ppNodes;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *p1;
  int local_34;
  int iNodeId;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots_local;
  Abc_Ntk_t *pNtk_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Abc_NtkIsStrash(pNtkNew);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x402,"void Abc_NtkAppendToCone(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    ppNodes = (Abc_Obj_t **)Vec_PtrArray(vRoots);
    iVar1 = Vec_PtrSize(vRoots);
    p_00 = Abc_NtkDfsNodes(pNtk,ppNodes,iVar1);
    pAVar2 = Abc_AigConst1(pNtkNew);
    pAVar3 = Abc_AigConst1(pNtk);
    (pAVar3->field_6).pCopy = pAVar2;
    for (local_34 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkCi(pNtk,local_34);
      iVar1 = Abc_NodeIsTravIdCurrent(pAVar2);
      if (iVar1 != 0) {
        p = pNtkNew->pManName;
        pcVar4 = Abc_ObjName(pAVar2);
        iVar1 = Nm_ManFindIdByNameTwoTypes(p,pcVar4,2,5);
        if (iVar1 == -1) {
          pAVar3 = Abc_NtkCreatePi(pNtkNew);
          (pAVar2->field_6).pCopy = pAVar3;
          pAVar3 = (pAVar2->field_6).pCopy;
          pcVar4 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
        }
        else {
          pAVar3 = Abc_NtkObj(pNtkNew,iVar1);
          (pAVar2->field_6).pCopy = pAVar3;
        }
      }
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(p_00), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_00,local_34);
      pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
      pAVar3 = Abc_ObjChild0Copy(pAVar2);
      p1 = Abc_ObjChild1Copy(pAVar2);
      pAVar3 = Abc_AigAnd(pMan,pAVar3,p1);
      (pAVar2->field_6).pCopy = pAVar3;
    }
    Vec_PtrFree(p_00);
    iVar1 = Abc_NtkCheck(pNtkNew);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkAppendToCone(): Network check has failed.\n");
    }
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                ,0x403,"void Abc_NtkAppendToCone(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

void Abc_NtkAppendToCone( Abc_Ntk_t * pNtkNew, Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, iNodeId;

    assert( Abc_NtkIsStrash(pNtkNew) );
    assert( Abc_NtkIsStrash(pNtk) );

    // collect the nodes in the TFI of the output (mark the TFI)
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)Vec_PtrArray(vRoots), Vec_PtrSize(vRoots) );

    // establish connection between the constant nodes
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        // skip CIs that are not used
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        // find the corresponding CI in the new network
        iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( iNodeId == -1 )
        {
            pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
        else
            pObj->pCopy = Abc_NtkObj( pNtkNew, iNodeId );
    }

    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );

    // do not add the COs
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkAppendToCone(): Network check has failed.\n" );
}